

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void name_public_member_cb(Fl_Choice *i,void *v)

{
  bool bVar1;
  int iVar2;
  Fl_Class_Type *pFVar3;
  Fl_Widget_Type *w;
  Fl_Type *o;
  int mod;
  void *v_local;
  Fl_Choice *i_local;
  
  if ((char *)v == "LOAD") {
    Fl_Choice::value(i,current_widget->public_);
    pFVar3 = Fl_Type::is_in_class(&current_widget->super_Fl_Type);
    if (pFVar3 == (Fl_Class_Type *)0x0) {
      (*(i->super_Fl_Menu_).super_Fl_Widget._vptr_Fl_Widget[6])();
    }
    else {
      (*(i->super_Fl_Menu_).super_Fl_Widget._vptr_Fl_Widget[5])();
    }
  }
  else {
    bVar1 = false;
    for (w = (Fl_Widget_Type *)Fl_Type::first; w != (Fl_Widget_Type *)0x0;
        w = (Fl_Widget_Type *)(w->super_Fl_Type).next) {
      if (((w->super_Fl_Type).selected != '\0') &&
         (iVar2 = (*(w->super_Fl_Type)._vptr_Fl_Type[0x17])(), iVar2 != 0)) {
        pFVar3 = Fl_Type::is_in_class(&w->super_Fl_Type);
        if (pFVar3 == (Fl_Class_Type *)0x0) {
          iVar2 = Fl_Choice::value(i);
          w->public_ = (uint)(0 < iVar2);
        }
        else {
          iVar2 = Fl_Choice::value(i);
          w->public_ = iVar2;
        }
        bVar1 = true;
      }
    }
    if (bVar1) {
      set_modflag(1);
      redraw_browser();
    }
  }
  return;
}

Assistant:

void name_public_member_cb(Fl_Choice* i, void* v) {
  if (v == LOAD) {
    i->value(current_widget->public_);
    if (current_widget->is_in_class()) i->show(); else i->hide();
  } else {
    int mod = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
        Fl_Widget_Type *w = ((Fl_Widget_Type*)o);
        if (w->is_in_class()) {
          w->public_ = i->value();
        } else {
          // if this is not in a class, it can be only private or public
          w->public_ = (i->value()>0);
        }
	mod = 1;
      }
    }
    if (mod) {
      set_modflag(1);
      redraw_browser();
    }
  }
}